

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardgestures.cpp
# Opt level: O0

Result __thiscall
QTapAndHoldGestureRecognizer::recognize
          (QTapAndHoldGestureRecognizer *this,QGesture *state,QObject *object,QEvent *event)

{
  long lVar1;
  bool bVar2;
  Type TVar3;
  int iVar4;
  QTapAndHoldGesturePrivate *pQVar5;
  QList<QEventPoint> *this_00;
  qsizetype qVar6;
  QEvent *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_FS_OFFSET;
  qreal qVar7;
  qreal in_XMM1_Qa;
  QGraphicsSceneMouseEvent *gsme_1;
  QMouseEvent *me_1;
  QEventPoint *p;
  QTouchEvent *ev_1;
  QTouchEvent *ev;
  QMouseEvent *me;
  QGraphicsSceneMouseEvent *gsme;
  QTapAndHoldGesturePrivate *d;
  QTapAndHoldGesture *q;
  QPoint delta_2;
  QPoint delta_1;
  QPoint delta;
  undefined4 in_stack_fffffffffffffe48;
  ResultFlag in_stack_fffffffffffffe4c;
  enum_type in_stack_fffffffffffffe50;
  enum_type in_stack_fffffffffffffe54;
  Duration in_stack_fffffffffffffe58;
  Duration duration;
  QPointF *in_stack_fffffffffffffe60;
  qreal local_50;
  qreal local_48;
  qreal local_20;
  qreal local_18;
  QFlagsStorageHelper<QGestureRecognizer::ResultFlag,_4> local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = QTapAndHoldGesture::d_func((QTapAndHoldGesture *)0x3562d0);
  if ((in_RDX == in_RSI) && (TVar3 = QEvent::type(in_RCX), TVar3 == Timer)) {
    QBasicTimer::stop();
    local_c.super_QFlagsStorage<QGestureRecognizer::ResultFlag>.i =
         (QFlagsStorage<QGestureRecognizer::ResultFlag>)
         ::operator|(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50);
  }
  else {
    TVar3 = QEvent::type(in_RCX);
    if (TVar3 == MouseButtonPress) {
      QSinglePointEvent::globalPosition((QSinglePointEvent *)0x3564ba);
      QPointF::toPoint(in_stack_fffffffffffffe60);
      QPointF::QPointF((QPointF *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       (QPoint *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      (pQVar5->position).xp = local_50;
      (pQVar5->position).yp = local_48;
      QGesture::setHotSpot
                ((QGesture *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (QPointF *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      ms<(char)49>();
      std::chrono::operator*
                ((int *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                 (duration<long,_std::ratio<1L,_1000L>_> *)0x356560);
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::
      duration<long,std::ratio<1l,1000l>,void>
                ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (duration<long,_std::ratio<1L,_1000L>_> *)
                 CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      QBasicTimer::start((QBasicTimer *)
                         CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                         in_stack_fffffffffffffe58,(QObject *)0x356594);
      QFlags<QGestureRecognizer::ResultFlag>::QFlags
                ((QFlags<QGestureRecognizer::ResultFlag> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe4c);
    }
    else {
      if (TVar3 != MouseButtonRelease) {
        if (TVar3 == MouseMove) {
          QSinglePointEvent::globalPosition((QSinglePointEvent *)0x35680e);
          QPointF::toPoint(in_stack_fffffffffffffe60);
          QPointF::toPoint(in_stack_fffffffffffffe60);
          ::operator-((QPoint *)in_stack_fffffffffffffe60,(QPoint *)in_stack_fffffffffffffe58.__r);
          bVar2 = QBasicTimer::isActive(&pQVar5->tapAndHoldTimer);
          if ((bVar2) &&
             (iVar4 = QPoint::manhattanLength((QPoint *)in_stack_fffffffffffffe60), iVar4 < 0x29)) {
            QFlags<QGestureRecognizer::ResultFlag>::QFlags
                      ((QFlags<QGestureRecognizer::ResultFlag> *)
                       CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       in_stack_fffffffffffffe4c);
          }
          else {
            QFlags<QGestureRecognizer::ResultFlag>::QFlags
                      ((QFlags<QGestureRecognizer::ResultFlag> *)
                       CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       in_stack_fffffffffffffe4c);
          }
          goto LAB_00356986;
        }
        if (TVar3 == GraphicsSceneMouseMove) {
          QGraphicsSceneMouseEvent::screenPos
                    ((QGraphicsSceneMouseEvent *)
                     CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
          QPointF::toPoint(in_stack_fffffffffffffe60);
          ::operator-((QPoint *)in_stack_fffffffffffffe60,(QPoint *)in_stack_fffffffffffffe58.__r);
          bVar2 = QBasicTimer::isActive(&pQVar5->tapAndHoldTimer);
          if ((bVar2) &&
             (iVar4 = QPoint::manhattanLength((QPoint *)in_stack_fffffffffffffe60), iVar4 < 0x29)) {
            QFlags<QGestureRecognizer::ResultFlag>::QFlags
                      ((QFlags<QGestureRecognizer::ResultFlag> *)
                       CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       in_stack_fffffffffffffe4c);
          }
          else {
            QFlags<QGestureRecognizer::ResultFlag>::QFlags
                      ((QFlags<QGestureRecognizer::ResultFlag> *)
                       CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       in_stack_fffffffffffffe4c);
          }
          goto LAB_00356986;
        }
        if (TVar3 == GraphicsSceneMousePress) {
          QGraphicsSceneMouseEvent::screenPos
                    ((QGraphicsSceneMouseEvent *)
                     CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
          QPointF::QPointF((QPointF *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                           (QPoint *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          (pQVar5->position).xp = local_20;
          (pQVar5->position).yp = local_18;
          QGesture::setHotSpot
                    ((QGesture *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                     (QPointF *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          ms<(char)49>();
          std::chrono::operator*
                    ((int *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                     (duration<long,_std::ratio<1L,_1000L>_> *)0x35645b);
          std::chrono::duration<long,std::ratio<1l,1000000000l>>::
          duration<long,std::ratio<1l,1000l>,void>
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                     CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                     (duration<long,_std::ratio<1L,_1000L>_> *)
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          QBasicTimer::start((QBasicTimer *)
                             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                             in_stack_fffffffffffffe58,(QObject *)0x35648f);
          QFlags<QGestureRecognizer::ResultFlag>::QFlags
                    ((QFlags<QGestureRecognizer::ResultFlag> *)
                     CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                     in_stack_fffffffffffffe4c);
          goto LAB_00356986;
        }
        if (TVar3 != GraphicsSceneMouseRelease) {
          if (TVar3 == TouchBegin) {
            QPointerEvent::points((QPointerEvent *)in_RCX);
            QList<QEventPoint>::at
                      ((QList<QEventPoint> *)
                       CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
            qVar7 = (qreal)QEventPoint::globalPressPosition();
            (pQVar5->position).xp = qVar7;
            (pQVar5->position).yp = in_XMM1_Qa;
            QGesture::setHotSpot
                      ((QGesture *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       (QPointF *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
            duration.__r = (rep)&pQVar5->tapAndHoldTimer;
            ms<(char)49>();
            std::chrono::operator*
                      ((int *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                       (duration<long,_std::ratio<1L,_1000L>_> *)0x35664f);
            std::chrono::duration<long,std::ratio<1l,1000000000l>>::
            duration<long,std::ratio<1l,1000l>,void>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                       CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       (duration<long,_std::ratio<1L,_1000L>_> *)
                       CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
            QBasicTimer::start((QBasicTimer *)
                               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                               duration,(QObject *)0x356683);
            QFlags<QGestureRecognizer::ResultFlag>::QFlags
                      ((QFlags<QGestureRecognizer::ResultFlag> *)
                       CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       in_stack_fffffffffffffe4c);
            goto LAB_00356986;
          }
          if (TVar3 == TouchUpdate) {
            bVar2 = QBasicTimer::isActive(&pQVar5->tapAndHoldTimer);
            if (bVar2) {
              this_00 = QPointerEvent::points((QPointerEvent *)in_RCX);
              qVar6 = QList<QEventPoint>::size(this_00);
              if (qVar6 == 1) {
                QPointerEvent::points((QPointerEvent *)in_RCX);
                QList<QEventPoint>::at
                          ((QList<QEventPoint> *)
                           CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                           CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
                QEventPoint::position();
                QPointF::toPoint(in_stack_fffffffffffffe60);
                QEventPoint::pressPosition();
                QPointF::toPoint(in_stack_fffffffffffffe60);
                ::operator-((QPoint *)in_stack_fffffffffffffe60,
                            (QPoint *)in_stack_fffffffffffffe58.__r);
                iVar4 = QPoint::manhattanLength((QPoint *)in_stack_fffffffffffffe60);
                if (iVar4 < 0x29) {
                  QFlags<QGestureRecognizer::ResultFlag>::QFlags
                            ((QFlags<QGestureRecognizer::ResultFlag> *)
                             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                             in_stack_fffffffffffffe4c);
                  goto LAB_00356986;
                }
              }
            }
            QFlags<QGestureRecognizer::ResultFlag>::QFlags
                      ((QFlags<QGestureRecognizer::ResultFlag> *)
                       CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       in_stack_fffffffffffffe4c);
            goto LAB_00356986;
          }
          if (TVar3 != TouchEnd) {
            QFlags<QGestureRecognizer::ResultFlag>::QFlags
                      ((QFlags<QGestureRecognizer::ResultFlag> *)
                       CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       in_stack_fffffffffffffe4c);
            goto LAB_00356986;
          }
        }
      }
      QFlags<QGestureRecognizer::ResultFlag>::QFlags
                ((QFlags<QGestureRecognizer::ResultFlag> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe4c);
    }
  }
LAB_00356986:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QFlagsStorageHelper<QGestureRecognizer::ResultFlag,_4>)
         (QFlagsStorageHelper<QGestureRecognizer::ResultFlag,_4>)
         local_c.super_QFlagsStorage<QGestureRecognizer::ResultFlag>.i;
}

Assistant:

QGestureRecognizer::Result
QTapAndHoldGestureRecognizer::recognize(QGesture *state, QObject *object,
                                        QEvent *event)
{
    QTapAndHoldGesture *q = static_cast<QTapAndHoldGesture *>(state);
    QTapAndHoldGesturePrivate *d = q->d_func();

    if (object == state && event->type() == QEvent::Timer) {
        d->tapAndHoldTimer.stop();
        return QGestureRecognizer::FinishGesture | QGestureRecognizer::ConsumeEventHint;
    }

    enum { TapRadius = 40 };

    switch (event->type()) {
#if QT_CONFIG(graphicsview)
    case QEvent::GraphicsSceneMousePress: {
        const QGraphicsSceneMouseEvent *gsme = static_cast<const QGraphicsSceneMouseEvent *>(event);
        d->position = gsme->screenPos();
        q->setHotSpot(d->position);
        d->tapAndHoldTimer.start(QTapAndHoldGesturePrivate::Timeout * 1ms, q);
        return QGestureRecognizer::MayBeGesture; // we don't show a sign of life until the timeout
    }
#endif
    case QEvent::MouseButtonPress: {
        const QMouseEvent *me = static_cast<const QMouseEvent *>(event);
        d->position = me->globalPosition().toPoint();
        q->setHotSpot(d->position);
        d->tapAndHoldTimer.start(QTapAndHoldGesturePrivate::Timeout * 1ms, q);
        return QGestureRecognizer::MayBeGesture; // we don't show a sign of life until the timeout
    }
    case QEvent::TouchBegin: {
        const QTouchEvent *ev = static_cast<const QTouchEvent *>(event);
        d->position = ev->points().at(0).globalPressPosition();
        q->setHotSpot(d->position);
        d->tapAndHoldTimer.start(QTapAndHoldGesturePrivate::Timeout * 1ms, q);
        return QGestureRecognizer::MayBeGesture; // we don't show a sign of life until the timeout
    }
#if QT_CONFIG(graphicsview)
    case QEvent::GraphicsSceneMouseRelease:
#endif
    case QEvent::MouseButtonRelease:
    case QEvent::TouchEnd:
        return QGestureRecognizer::CancelGesture; // get out of the MayBeGesture state
    case QEvent::TouchUpdate: {
        const QTouchEvent *ev = static_cast<const QTouchEvent *>(event);
        if (d->tapAndHoldTimer.isActive() && ev->points().size() == 1) {
            const QEventPoint &p = ev->points().at(0);
            QPoint delta = p.position().toPoint() - p.pressPosition().toPoint();
            if (delta.manhattanLength() <= TapRadius)
                return QGestureRecognizer::MayBeGesture;
        }
        return QGestureRecognizer::CancelGesture;
    }
    case QEvent::MouseMove: {
        const QMouseEvent *me = static_cast<const QMouseEvent *>(event);
        QPoint delta = me->globalPosition().toPoint() - d->position.toPoint();
        if (d->tapAndHoldTimer.isActive() && delta.manhattanLength() <= TapRadius)
            return QGestureRecognizer::MayBeGesture;
        return QGestureRecognizer::CancelGesture;
    }
#if QT_CONFIG(graphicsview)
    case QEvent::GraphicsSceneMouseMove: {
        const QGraphicsSceneMouseEvent *gsme = static_cast<const QGraphicsSceneMouseEvent *>(event);
        QPoint delta = gsme->screenPos() - d->position.toPoint();
        if (d->tapAndHoldTimer.isActive() && delta.manhattanLength() <= TapRadius)
            return QGestureRecognizer::MayBeGesture;
        return QGestureRecognizer::CancelGesture;
    }
#endif
    default:
        return QGestureRecognizer::Ignore;
    }
}